

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

TestCase * __thiscall testing::UnitTest::GetTestCase(UnitTest *this,int i)

{
  UnitTestImpl *pUVar1;
  pointer piVar2;
  TestCase *pTVar3;
  long in_FS_OFFSET;
  
  if (-1 < i) {
    pUVar1 = this->impl_;
    piVar2 = (pUVar1->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((i < (int)((ulong)((long)(pUVar1->test_case_indices_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar2) >> 2)) &&
       (-1 < piVar2[(uint)i])) {
      pTVar3 = (pUVar1->test_cases_).
               super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl
               .super__Vector_impl_data._M_start[(uint)i];
      goto LAB_0014c9fa;
    }
  }
  pTVar3 = (TestCase *)0x0;
LAB_0014c9fa:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return pTVar3;
  }
  __stack_chk_fail();
}

Assistant:

const TestCase* UnitTest::GetTestCase(int i) const {
  return impl()->GetTestCase(i);
}